

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<bssl::(anonymous_namespace)::TrustTokenBadKeyTest_BadKey_Test>::CreateTest
          (ParameterizedTestFactory<bssl::(anonymous_namespace)::TrustTokenBadKeyTest_BadKey_Test>
           *this)

{
  TRUST_TOKEN_METHOD *method_arg;
  TrustTokenProtocolTestBase *this_00;
  ParamType *pPVar1;
  
  WithParamInterface<std::tuple<trust_token_method_st_const*,bool,bool,int>>::parameter_ =
       &this->parameter_;
  this_00 = (TrustTokenProtocolTestBase *)operator_new(0x58);
  pPVar1 = WithParamInterface<std::tuple<const_trust_token_method_st_*,_bool,_bool,_int>_>::GetParam
                     ();
  method_arg = (pPVar1->super__Tuple_impl<0UL,_const_trust_token_method_st_*,_bool,_bool,_int>).
               super__Head_base<0UL,_const_trust_token_method_st_*,_false>._M_head_impl;
  pPVar1 = WithParamInterface<std::tuple<const_trust_token_method_st_*,_bool,_bool,_int>_>::GetParam
                     ();
  bssl::anon_unknown_0::TrustTokenProtocolTestBase::TrustTokenProtocolTestBase
            (this_00,method_arg,
             (bool)(pPVar1->super__Tuple_impl<0UL,_const_trust_token_method_st_*,_bool,_bool,_int>).
                   super__Tuple_impl<1UL,_bool,_bool,_int>.super__Tuple_impl<2UL,_bool,_int>.
                   field_0x5);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__TrustTokenBadKeyTest_0068fad0;
  this_00[1].super_Test._vptr_Test = (_func_int **)&PTR__TrustTokenBadKeyTest_BadKey_Test_0068fb10;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }